

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dsa_asn1.cc
# Opt level: O0

int dsa_priv_decode(EVP_PKEY *out,CBS *params,CBS *key)

{
  BIGNUM *a;
  BIGNUM *p;
  BIGNUM *m;
  UniquePtr<DSA> cbs;
  bool bVar1;
  int iVar2;
  DSA *__p;
  size_t sVar3;
  BIGNUM *pBVar4;
  pointer pdVar5;
  pointer pbVar6;
  unique_ptr<bignum_ctx,_bssl::internal::Deleter> local_40;
  UniquePtr<BN_CTX> ctx;
  unique_ptr<dsa_st,_bssl::internal::Deleter> local_30;
  UniquePtr<DSA> dsa;
  CBS *key_local;
  CBS *params_local;
  EVP_PKEY *out_local;
  
  dsa._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_dsa_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<dsa_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_data<dsa_st,_bssl::internal::Deleter,_true,_true>)key;
  __p = DSA_parse_parameters(params);
  std::unique_ptr<dsa_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<dsa_st,bssl::internal::Deleter> *)&local_30,__p);
  bVar1 = std::operator==(&local_30,(nullptr_t)0x0);
  if (!bVar1) {
    sVar3 = CBS_len(params);
    if (sVar3 == 0) {
      pBVar4 = BN_new();
      pdVar5 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::operator->(&local_30);
      pdVar5->priv_key = (BIGNUM *)pBVar4;
      pdVar5 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::operator->(&local_30);
      cbs = dsa;
      if (pdVar5->priv_key == (BIGNUM *)0x0) {
        out_local._4_4_ = 0;
        ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl._4_4_ = 1;
        goto LAB_0020a8f2;
      }
      pdVar5 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::operator->(&local_30);
      iVar2 = BN_parse_asn1_unsigned
                        ((CBS *)cbs._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t
                                .super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl,pdVar5->priv_key
                        );
      if (iVar2 != 0) {
        sVar3 = CBS_len((CBS *)dsa._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl);
        if (sVar3 == 0) {
          pdVar5 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::get(&local_30);
          iVar2 = dsa_check_key(pdVar5);
          if (iVar2 == 0) {
            ERR_put_error(6,0,0x66,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dsa_asn1.cc"
                          ,0x68);
            out_local._4_4_ = 0;
            ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl._4_4_ = 1;
            goto LAB_0020a8f2;
          }
          pbVar6 = (pointer)BN_CTX_new();
          std::unique_ptr<bignum_ctx,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<bignum_ctx,bssl::internal::Deleter> *)&local_40,pbVar6);
          pBVar4 = BN_new();
          pdVar5 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::operator->(&local_30);
          pdVar5->pub_key = (BIGNUM *)pBVar4;
          bVar1 = std::operator==(&local_40,(nullptr_t)0x0);
          if (bVar1) {
LAB_0020a8ae:
            out_local._4_4_ = 0;
          }
          else {
            pdVar5 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::operator->(&local_30);
            if (pdVar5->pub_key == (BIGNUM *)0x0) goto LAB_0020a8ae;
            pdVar5 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::operator->(&local_30);
            pBVar4 = (BIGNUM *)pdVar5->pub_key;
            pdVar5 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::operator->(&local_30);
            a = (BIGNUM *)pdVar5->g;
            pdVar5 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::operator->(&local_30);
            p = (BIGNUM *)pdVar5->priv_key;
            pdVar5 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::operator->(&local_30);
            m = (BIGNUM *)pdVar5->p;
            pbVar6 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get(&local_40);
            iVar2 = BN_mod_exp_mont_consttime(pBVar4,a,p,m,(BN_CTX *)pbVar6,(BN_MONT_CTX *)0x0);
            if (iVar2 == 0) goto LAB_0020a8ae;
            pdVar5 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::release(&local_30);
            EVP_PKEY_assign_DSA(out,pdVar5);
            out_local._4_4_ = 1;
          }
          ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl._4_4_ = 1;
          std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::~unique_ptr(&local_40);
          goto LAB_0020a8f2;
        }
      }
      ERR_put_error(6,0,0x66,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dsa_asn1.cc"
                    ,0x60);
      out_local._4_4_ = 0;
      ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl._4_4_ = 1;
      goto LAB_0020a8f2;
    }
  }
  ERR_put_error(6,0,0x66,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dsa_asn1.cc"
                ,0x57);
  out_local._4_4_ = 0;
  ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl._4_4_ = 1;
LAB_0020a8f2:
  std::unique_ptr<dsa_st,_bssl::internal::Deleter>::~unique_ptr(&local_30);
  return out_local._4_4_;
}

Assistant:

static int dsa_priv_decode(EVP_PKEY *out, CBS *params, CBS *key) {
  // See PKCS#11, v2.40, section 2.5.

  // Decode parameters.
  bssl::UniquePtr<DSA> dsa(DSA_parse_parameters(params));
  if (dsa == nullptr || CBS_len(params) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  dsa->priv_key = BN_new();
  if (dsa->priv_key == nullptr) {
    return 0;
  }
  if (!BN_parse_asn1_unsigned(key, dsa->priv_key) || CBS_len(key) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  // To avoid DoS attacks when importing private keys, check bounds on |dsa|.
  // This bounds |dsa->priv_key| against |dsa->q| and bounds |dsa->q|'s bit
  // width.
  if (!dsa_check_key(dsa.get())) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  // Calculate the public key.
  bssl::UniquePtr<BN_CTX> ctx(BN_CTX_new());
  dsa->pub_key = BN_new();
  if (ctx == nullptr || dsa->pub_key == nullptr ||
      !BN_mod_exp_mont_consttime(dsa->pub_key, dsa->g, dsa->priv_key, dsa->p,
                                 ctx.get(), nullptr)) {
    return 0;
  }

  EVP_PKEY_assign_DSA(out, dsa.release());
  return 1;
}